

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O2

bool duckdb::DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<short>,false>
               (DecimalCastData<short> *state,uint8_t digit)

{
  short sVar1;
  bool bVar2;
  undefined3 in_register_00000031;
  
  sVar1 = state->result;
  bVar2 = true;
  if (CONCAT31(in_register_00000031,digit) != 0 || sVar1 != 0) {
    if (((uint)state->width - (uint)state->scale != (uint)state->digit_count) &&
       (state->digit_count = state->digit_count + 1, sVar1 < 0xccd)) {
      state->result = (short)CONCAT31(in_register_00000031,digit) + sVar1 * 10;
      return bVar2;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool HandleDigit(T &state, uint8_t digit) {
		if (state.result == 0 && digit == 0) {
			// leading zero's don't count towards the digit count
			return true;
		}
		if (state.digit_count == state.width - state.scale) {
			// width of decimal type is exceeded!
			return false;
		}
		state.digit_count++;
		if (NEGATIVE) {
			if (state.result < (NumericLimits<typename T::StoreType>::Minimum() / 10)) {
				return false;
			}
			state.result = state.result * 10 - digit;
		} else {
			if (state.result > (NumericLimits<typename T::StoreType>::Maximum() / 10)) {
				return false;
			}
			state.result = state.result * 10 + digit;
		}
		return true;
	}